

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O2

R_conflict QChar::fromUcs4(char32_t c)

{
  char32_t cVar1;
  char16_t acVar2 [2];
  R_conflict RVar3;
  uint uVar4;
  
  uVar4 = 0;
  cVar1 = c;
  if (0xffff < (uint)c) {
    cVar1 = ((uint)c >> 10) + L'ퟀ';
    uVar4 = (c & 0x3ffU) << 0x10 | 0xdc000000;
  }
  acVar2 = (char16_t  [2])(cVar1 & 0xffffU | uVar4);
  RVar3.chars[0] = acVar2[0];
  RVar3.chars[1] = acVar2[1];
  return (R_conflict)RVar3.chars;
}

Assistant:

[[nodiscard]] constexpr auto QChar::fromUcs4(char32_t c) noexcept
{
    struct R {
        char16_t chars[2];
        [[nodiscard]] constexpr operator QStringView() const noexcept { return {begin(), end()}; }
        [[nodiscard]] constexpr qsizetype size() const noexcept { return chars[1] ? 2 : 1; }
        [[nodiscard]] constexpr const char16_t *begin() const noexcept { return chars; }
        [[nodiscard]] constexpr const char16_t *end() const noexcept { return begin() + size(); }
    };
    return requiresSurrogates(c) ? R{{QChar::highSurrogate(c),
                                      QChar::lowSurrogate(c)}} :
                                   R{{char16_t(c), u'\0'}} ;
}